

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O3

uint8_t mpack_node_u8(mpack_node_t node)

{
  mpack_type_t mVar1;
  anon_union_8_7_c87e5bf0_for_value aVar2;
  mpack_tree_t *pmVar3;
  
  pmVar3 = node.tree;
  if (pmVar3->error == mpack_ok) {
    mVar1 = (node.data)->type;
    if (((mVar1 == mpack_type_int) || (mVar1 == mpack_type_uint)) &&
       (aVar2 = (node.data)->value, aVar2.u < 0x100)) goto LAB_00105292;
    pmVar3->error = mpack_error_type;
    if (pmVar3->error_fn != (mpack_tree_error_t)0x0) {
      (*pmVar3->error_fn)(pmVar3,mpack_error_type);
      return '\0';
    }
  }
  aVar2.d = 0.0;
LAB_00105292:
  return aVar2._0_1_;
}

Assistant:

MPACK_INLINE uint8_t mpack_node_u8(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return 0;

    if (node.data->type == mpack_type_uint) {
        if (node.data->value.u <= UINT8_MAX)
            return (uint8_t)node.data->value.u;
    } else if (node.data->type == mpack_type_int) {
        if (node.data->value.i >= 0 && node.data->value.i <= UINT8_MAX)
            return (uint8_t)node.data->value.i;
    }

    mpack_node_flag_error(node, mpack_error_type);
    return 0;
}